

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

void __thiscall
Js::JavascriptString::FinishCopy
          (JavascriptString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  char16 *pcVar6;
  undefined1 local_58 [8];
  StringCopyInfo copyInfo;
  
  bVar3 = StringCopyInfoStack::IsEmpty(nestedStringTreeCopyInfos);
  if (!bVar3) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    copyInfo._16_8_ = nestedStringTreeCopyInfos;
    do {
      StringCopyInfoStack::Pop((StringCopyInfo *)local_58,nestedStringTreeCopyInfos);
      pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_58);
      if (this->m_charLength < pJVar5->m_charLength) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xb46,"(copyInfo.SourceString()->GetLength() <= GetLength())",
                                    "copyInfo.SourceString()->GetLength() <= GetLength()");
        if (!bVar3) goto LAB_00d19d76;
        *puVar4 = 0;
      }
      pcVar6 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_58);
      if (pcVar6 < buffer) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xb47,"(copyInfo.DestinationBuffer() >= buffer)",
                                    "copyInfo.DestinationBuffer() >= buffer");
        if (!bVar3) goto LAB_00d19d76;
        *puVar4 = 0;
      }
      pcVar6 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_58);
      TVar1 = this->m_charLength;
      pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_58);
      if (buffer + (TVar1 - pJVar5->m_charLength) < pcVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xb48,
                                    "(copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength()))"
                                    ,
                                    "copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength())"
                                   );
        if (!bVar3) {
LAB_00d19d76:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_58);
      pcVar6 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_58);
      nestedStringTreeCopyInfos = (StringCopyInfoStack *)copyInfo._16_8_;
      Copy(pJVar5,pcVar6,(StringCopyInfoStack *)copyInfo._16_8_,'\0');
      bVar3 = StringCopyInfoStack::IsEmpty(nestedStringTreeCopyInfos);
    } while (!bVar3);
  }
  return;
}

Assistant:

void JavascriptString::FinishCopy(__inout_xcount(m_charLength) char16 *const buffer, StringCopyInfoStack &nestedStringTreeCopyInfos)
    {
        while (!nestedStringTreeCopyInfos.IsEmpty())
        {
            const StringCopyInfo copyInfo(nestedStringTreeCopyInfos.Pop());
            Assert(copyInfo.SourceString()->GetLength() <= GetLength());
            Assert(copyInfo.DestinationBuffer() >= buffer);
            Assert(copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength()));
            copyInfo.SourceString()->Copy(copyInfo.DestinationBuffer(), nestedStringTreeCopyInfos, 0);
        }
    }